

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O1

int scanPastString(char *buffer,int buffer_len,int offset,int *lines)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int needle_len;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  int matchlen;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < offset) {
    uVar12 = (ulong)(uint)offset;
    if (buffer[uVar12] == '\"') {
      uVar6 = offset - 1;
      bVar13 = true;
      bVar5 = false;
      bVar9 = false;
      bVar10 = false;
      do {
        bVar11 = bVar10;
        bVar4 = bVar5;
        if ((((uVar6 == 0) || ((buffer[uVar6] != '\r' && (buffer[uVar6] != '\n')))) ||
            (iVar7 = -2, buffer[(ulong)uVar6 - 1] != '\\')) &&
           (((((int)uVar6 < 2 || (buffer[uVar6] != '\n')) || (buffer[(ulong)uVar6 - 1] != '\r')) ||
            (iVar7 = -3, buffer[(ulong)uVar6 - 2] != '\\')))) {
          if (bVar9) {
            if (buffer[uVar6] != 'u') break;
            iVar7 = -1;
            bVar9 = false;
            bVar11 = true;
          }
          else {
            if (bVar10) break;
            if (((int)uVar6 < 2) || (buffer[uVar6] != '8')) {
              bVar1 = buffer[uVar6];
              bVar11 = true;
              iVar7 = -1;
              if (bVar1 < 0x55) {
                if ((bVar1 != 0x4c) &&
                   ((bVar1 != 0x52 || (iVar7 = -1, bVar11 = bVar10, bVar4 = true, bVar5)))) break;
              }
              else if ((bVar1 != 0x55) && (iVar7 = -1, bVar1 != 0x75)) break;
            }
            else {
              bVar9 = true;
              iVar7 = -1;
            }
          }
        }
        bVar5 = bVar4;
        bVar10 = bVar11;
        uVar6 = uVar6 + iVar7;
        bVar13 = -1 < (int)uVar6;
      } while (bVar13);
      if ((bool)(bVar13 & bVar5)) {
        cVar2 = buffer[uVar6];
        iVar7 = isalnum((int)cVar2);
        if (iVar7 != 0) {
          bVar5 = false;
        }
        if (cVar2 == 0x5f) {
          bVar5 = false;
        }
      }
      if (bVar5) {
        uVar8 = skipEscapedLineEnds(buffer,buffer_len,offset + 1,lines);
        uVar12 = (long)(int)uVar8;
        uVar6 = uVar8;
        if ((int)uVar8 < buffer_len) {
          do {
            if (buffer[(int)uVar6] == '(') break;
            if ((long)uVar12 < (long)(int)uVar6) {
              buffer[uVar12] = buffer[(int)uVar6];
            }
            uVar12 = uVar12 + 1;
            uVar6 = skipEscapedLineEnds(buffer,buffer_len,uVar6 + 1,lines);
          } while ((int)uVar6 < buffer_len);
        }
        else {
          uVar12 = (ulong)uVar8;
        }
        needle_len = (int)uVar12 - uVar8;
        local_40 = 0;
        local_3c = needle_len;
        iVar7 = skipEscapedLineEnds(buffer,buffer_len,uVar6 + 1,lines);
        if (iVar7 < buffer_len) {
          do {
            cVar2 = buffer[iVar7];
            if ((cVar2 == '\n') || (cVar2 == '\r')) {
              *lines = *lines + 1;
            }
            else if ((cVar2 == ')') &&
                    (((needle_len < 1 ||
                      (bVar5 = matchWhileUnsplitting
                                         (buffer,buffer_len,iVar7 + 1,buffer + (int)uVar8,needle_len
                                          ,&local_3c,&local_40), bVar5)) &&
                     (buffer[(long)iVar7 + (long)local_3c + 1] == '\"')))) break;
            local_40 = 0;
            iVar7 = skipEscapedLineEnds(buffer,buffer_len,iVar7 + 1,lines);
          } while (iVar7 < buffer_len);
        }
        *lines = *lines + local_40;
        iVar7 = local_3c + iVar7 + 1;
        goto LAB_00198795;
      }
    }
    else if ((((0xfffffff5 < (byte)buffer[uVar12 - 1] - 0x3a) && ((int)(uVar12 + 1) < buffer_len))
             && (0xfffffff5 < (byte)buffer[uVar12 + 1] - 0x3a)) &&
            ((iVar7 = offset, buffer[uVar12 - 1] != 0x38 || offset == 1 ||
             (buffer[uVar12 - 2] != 'u')))) goto LAB_00198795;
  }
  iVar7 = offset + 1;
  if (iVar7 < buffer_len) {
    cVar2 = buffer[offset];
    do {
      cVar3 = buffer[iVar7];
      if (cVar3 == cVar2) break;
      if ((cVar3 == '\n') || (cVar3 == '\r')) {
        *lines = *lines + 1;
      }
      else if (cVar3 == '\\') {
        iVar7 = offset + 2;
      }
      offset = iVar7;
      iVar7 = offset + 1;
    } while (iVar7 < buffer_len);
  }
LAB_00198795:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int scanPastString(char *buffer, int buffer_len, int offset, int *lines)
{
    // http://en.cppreference.com/w/cpp/language/string_literal
    // It might be a C++11 raw string.
    bool israw = false;

    Q_ASSERT(offset < buffer_len);
    if (offset <= 0) {
        // skip, neither of these special cases applies here
    } else if (buffer[offset] == '"') {
        int explore = offset - 1;
        bool prefix = false; // One of L, U, u or u8 may appear before R
        bool saw8 = false; // Partial scan of u8
        while (explore >= 0) {
            // Cope with backslash-newline interruptions of the prefix:
            if (explore > 0
                && qmake_endOfLine(buffer[explore])
                && buffer[explore - 1] == '\\') {
                explore -= 2;
            } else if (explore > 1
                       && buffer[explore] == '\n'
                       && buffer[explore - 1] == '\r'
                       && buffer[explore - 2] == '\\') {
                explore -= 3;
                // Remaining cases can only decrement explore by one at a time:
            } else if (saw8 && buffer[explore] == 'u') {
                explore--;
                saw8 = false;
                prefix = true;
            } else if (saw8 || prefix) {
                break;
            } else if (explore > 1 && buffer[explore] == '8') {
                explore--;
                saw8 = true;
            } else if (buffer[explore] == 'L'
                       || buffer[explore] == 'U'
                       || buffer[explore] == 'u') {
                explore--;
                prefix = true;
            } else if (buffer[explore] == 'R') {
                if (israw)
                    break;
                explore--;
                israw = true;
            } else {
                break;
            }
        }
        // Check the R (with possible prefix) isn't just part of an identifier:
        if (israw && explore >= 0
            && (isalnum(buffer[explore]) || buffer[explore] == '_')) {
            israw = false;
        }

    } else {
        // Is this apostrophe a digit separator rather than the start of a
        // character literal ? If so, there was no string to scan past, so
        // treat the apostrophe as both open and close.
        Q_ASSERT(buffer[offset] == '\'' && offset > 0);
        // Wrap std::isdigit() to package the casting to unsigned char.
        const auto isDigit = [](unsigned char c) { return std::isdigit(c); };
        if (isDigit(buffer[offset - 1]) && offset + 1 < buffer_len && isDigit(buffer[offset + 1])) {
            // One exception: u8'0' is a perfectly good character literal.
            if (offset < 2 || buffer[offset - 1] != '8' || buffer[offset - 2] != 'u')
                return offset;
        }
    }

    if (israw) {
#define SKIP_BSNL(pos) skipEscapedLineEnds(buffer, buffer_len, (pos), lines)

        offset = SKIP_BSNL(offset + 1);
        const char *const delim = buffer + offset;
        int clean = offset;
        while (offset < buffer_len && buffer[offset] != '(') {
            if (clean < offset)
                buffer[clean++] = buffer[offset];
            else
                clean++;

            offset = SKIP_BSNL(offset + 1);
        }
        /*
          Not checking correctness (trust real compiler to do that):
          - no controls, spaces, '(', ')', '\\' or (presumably) '"' in delim;
          - at most 16 bytes in delim

          Raw strings are surely defined after phase 2, when BSNLs are resolved;
          so the delimiter's exclusion of '\\' and space (including newlines)
          applies too late to save us the need to cope with BSNLs in it.
        */

        const int delimlen = buffer + clean - delim;
        int matchlen = delimlen, extralines = 0;
        while ((offset = SKIP_BSNL(offset + 1)) < buffer_len
               && (buffer[offset] != ')'
                   || (delimlen > 0 &&
                       !matchWhileUnsplitting(buffer, buffer_len,
                                              offset + 1, delim, delimlen,
                                              &matchlen, &extralines))
                   || buffer[offset + 1 + matchlen] != '"')) {
            // skip, but keep track of lines
            if (qmake_endOfLine(buffer[offset]))
                ++*lines;
            extralines = 0;
        }
        *lines += extralines; // from the match
        // buffer[offset] is ')'
        offset += 1 + matchlen; // 1 for ')', then delim
        // buffer[offset] is '"'

#undef SKIP_BSNL
    } else { // Traditional string or char literal:
        const char term = buffer[offset];
        while (++offset < buffer_len && buffer[offset] != term) {
            if (buffer[offset] == '\\')
                ++offset;
            else if (qmake_endOfLine(buffer[offset]))
                ++*lines;
        }
    }

    return offset;
}